

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_unnest.cpp
# Opt level: O2

void __thiscall
duckdb::UnnestOperatorState::PrepareInput
          (UnnestOperatorState *this,DataChunk *input,
          vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
          *select_list)

{
  unsafe_vector<idx_t> *this_00;
  DataChunk *this_01;
  sel_t *psVar1;
  bool bVar2;
  reference this_02;
  reference pvVar3;
  UnifiedVectorFormat *format;
  idx_t iVar4;
  pointer puVar5;
  idx_t r;
  size_type __n;
  idx_t r_1;
  ulong uVar6;
  ulong row_idx;
  value_type *child_vector;
  LogicalType local_48;
  
  this_01 = &this->list_data;
  DataChunk::Reset(this_01);
  ExpressionExecutor::Execute(&this->executor,input,this_01);
  DataChunk::Verify(this_01);
  for (uVar6 = 0;
      uVar6 < (ulong)(((long)(this->list_data).data.
                             super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                             super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                             _M_impl.super__Vector_impl_data._M_finish -
                      (long)(this->list_data).data.
                            super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                            super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                            _M_impl.super__Vector_impl_data._M_start) / 0x68); uVar6 = uVar6 + 1) {
    this_02 = vector<duckdb::Vector,_true>::get<true>(&this_01->data,uVar6);
    iVar4 = (this->list_data).count;
    pvVar3 = vector<duckdb::UnifiedVectorFormat,_true>::get<true>(&this->list_vector_data,uVar6);
    Vector::ToUnifiedFormat(this_02,iVar4,pvVar3);
    LogicalType::LogicalType(&local_48,SQLNULL);
    bVar2 = LogicalType::operator==(&this_02->type,&local_48);
    LogicalType::~LogicalType(&local_48);
    if (bVar2) {
      format = vector<duckdb::UnifiedVectorFormat,_true>::get<true>(&this->list_child_data,uVar6);
      iVar4 = 0;
    }
    else {
      iVar4 = ListVector::GetListSize(this_02);
      this_02 = ListVector::GetEntry(this_02);
      format = vector<duckdb::UnifiedVectorFormat,_true>::get<true>(&this->list_child_data,uVar6);
    }
    Vector::ToUnifiedFormat(this_02,iVar4,format);
  }
  uVar6 = (this->list_data).count;
  this_00 = &this->unnest_lengths;
  puVar5 = (this->unnest_lengths).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((ulong)((long)(this->unnest_lengths).
                    super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_finish - (long)puVar5 >> 3) < uVar6) {
    ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
              (&this_00->super_vector<unsigned_long,_std::allocator<unsigned_long>_>,uVar6);
    puVar5 = (this_00->super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start;
  }
  for (uVar6 = 0; uVar6 < (this->list_data).count; uVar6 = uVar6 + 1) {
    puVar5[uVar6] = 0;
  }
  for (__n = 0; __n < (ulong)(((long)(this->list_data).data.
                                     super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                                     super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                              (long)(this->list_data).data.
                                    super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                                    super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                    ._M_impl.super__Vector_impl_data._M_start) / 0x68);
      __n = __n + 1) {
    pvVar3 = vector<duckdb::UnifiedVectorFormat,_true>::get<true>(&this->list_vector_data,__n);
    for (uVar6 = 0; uVar6 < (this->list_data).count; uVar6 = uVar6 + 1) {
      psVar1 = pvVar3->sel->sel_vector;
      row_idx = uVar6;
      if (psVar1 != (sel_t *)0x0) {
        row_idx = (ulong)psVar1[uVar6];
      }
      bVar2 = TemplatedValidityMask<unsigned_long>::RowIsValid
                        (&(pvVar3->validity).super_TemplatedValidityMask<unsigned_long>,row_idx);
      if (bVar2) {
        puVar5 = (this_00->super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start;
        if (puVar5[uVar6] < *(ulong *)(pvVar3->data + row_idx * 0x10 + 8)) {
          puVar5[uVar6] = *(ulong *)(pvVar3->data + row_idx * 0x10 + 8);
        }
      }
    }
  }
  this->first_fetch = false;
  return;
}

Assistant:

void UnnestOperatorState::PrepareInput(DataChunk &input, const vector<unique_ptr<Expression>> &select_list) {
	list_data.Reset();
	// execute the expressions inside each UNNEST in the select_list to get the list data
	// execution results (lists) are kept in list_data chunk
	executor.Execute(input, list_data);

	// verify incoming lists
	list_data.Verify();
	D_ASSERT(input.size() == list_data.size());
	D_ASSERT(list_data.ColumnCount() == select_list.size());
	D_ASSERT(list_vector_data.size() == list_data.ColumnCount());
	D_ASSERT(list_child_data.size() == list_data.ColumnCount());

	// get the UnifiedVectorFormat of each list_data vector (LIST vectors for the different UNNESTs)
	// both for the vector itself and its child vector
	for (idx_t col_idx = 0; col_idx < list_data.ColumnCount(); col_idx++) {
		auto &list_vector = list_data.data[col_idx];
		list_vector.ToUnifiedFormat(list_data.size(), list_vector_data[col_idx]);

		if (list_vector.GetType() == LogicalType::SQLNULL) {
			// UNNEST(NULL): SQLNULL vectors don't have child vectors, but we need to point to the child vector of
			// each vector, so we just get the UnifiedVectorFormat of the vector itself
			auto &child_vector = list_vector;
			child_vector.ToUnifiedFormat(0, list_child_data[col_idx]);
		} else {
			auto list_size = ListVector::GetListSize(list_vector);
			auto &child_vector = ListVector::GetEntry(list_vector);
			child_vector.ToUnifiedFormat(list_size, list_child_data[col_idx]);
		}
	}
	// get the unnest lengths
	if (list_data.size() > unnest_lengths.size()) {
		unnest_lengths.resize(list_data.size());
	}
	for (idx_t r = 0; r < list_data.size(); r++) {
		unnest_lengths[r] = 0;
	}
	for (idx_t col_idx = 0; col_idx < list_data.ColumnCount(); col_idx++) {
		auto &vector_data = list_vector_data[col_idx];
		for (idx_t r = 0; r < list_data.size(); r++) {
			auto current_idx = vector_data.sel->get_index(r);
			if (!vector_data.validity.RowIsValid(current_idx)) {
				continue;
			}
			// check if this list is longer than the current unnest length
			auto list_data_entries = UnifiedVectorFormat::GetData<list_entry_t>(vector_data);
			auto list_entry = list_data_entries[current_idx];
			if (list_entry.length > unnest_lengths[r]) {
				unnest_lengths[r] = list_entry.length;
			}
		}
	}

	first_fetch = false;
}